

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O3

string * __thiscall
Json::JsonParser::parseString_abi_cxx11_(string *__return_storage_ptr__,JsonParser *this,char prev)

{
  JsonReader *this_00;
  string *psVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  JsonException *pJVar5;
  JsonParser *this_01;
  string hex_oct;
  string local_58;
  string *local_38;
  
  (this->__buffer_value)._M_string_length = 0;
  *(this->__buffer_value)._M_dataplus._M_p = '\0';
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::_M_replace_aux((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01')
  ;
  this_00 = &this->__reader;
  while( true ) {
    while( true ) {
      cVar2 = JsonReader::get(this_00);
      if (cVar2 != '\\') break;
      if (this->__escape == false) {
        std::__cxx11::string::_M_replace_aux
                  ((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01');
        JsonReader::get(this_00);
        goto LAB_00109633;
      }
      cVar2 = JsonReader::get(this_00);
      this_01 = (JsonParser *)(ulong)(uint)(int)cVar2;
      bVar3 = is_escape(cVar2);
      if (bVar3) {
        convert2escape(this_01,cVar2);
        goto LAB_00109633;
      }
      if (cVar2 == 'x' || (byte)(cVar2 - 0x30U) < 10) {
        resolve_escape_number_abi_cxx11_(&local_58,this,cVar2);
        if (local_58._M_string_length == 0) {
          pJVar5 = (JsonException *)__cxa_allocate_exception(0x50);
          JsonException::JsonException(pJVar5,this_00);
          __cxa_throw(pJVar5,&JsonException::typeinfo,JsonException::~JsonException);
        }
        std::__cxx11::string::append((char *)this);
      }
      else {
        if (cVar2 != 'u') {
          pJVar5 = (JsonException *)__cxa_allocate_exception(0x50);
          JsonException::JsonException(pJVar5,this_00);
          goto LAB_00109790;
        }
        resolve_escape_hex_unicode_abi_cxx11_(&local_58,this);
        if (local_58._M_string_length == 0) {
          pJVar5 = (JsonException *)__cxa_allocate_exception(0x50);
          JsonException::JsonException(pJVar5,this_00);
          __cxa_throw(pJVar5,&JsonException::typeinfo,JsonException::~JsonException);
        }
        std::__cxx11::string::append((char *)this);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if (cVar2 == '\"') break;
LAB_00109633:
    std::__cxx11::string::_M_replace_aux
              ((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01');
  }
  std::__cxx11::string::_M_replace_aux((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01')
  ;
  do {
    bVar4 = JsonReader::peek(this_00);
    psVar1 = local_38;
    if ((((bVar4 - 0x2c < 0x32) && ((0x2800000004001U >> ((ulong)(bVar4 - 0x2c) & 0x3f) & 1) != 0))
        || (bVar4 == 0x7b)) || (bVar4 == 0x7d)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_38,(this->__buffer_value)._M_dataplus._M_p,
                 (allocator<char> *)&local_58);
      return psVar1;
    }
    bVar4 = JsonReader::get(this_00);
  } while ((bVar4 < 0x21) && ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0));
  pJVar5 = (JsonException *)__cxa_allocate_exception(0x50);
  JsonException::JsonException(pJVar5,this_00);
LAB_00109790:
  __cxa_throw(pJVar5,&JsonException::typeinfo,JsonException::~JsonException);
}

Assistant:

std::string Json::JsonParser::parseString(char prev) {
    buffer_reset();
    buffer_append(prev);
    for (;;) {
        char s = __reader.get();
        if (s == '\\') {
            if (!__escape) {
                buffer_append('\\');
                buffer_append(__reader.get());
                continue;
            }
            char sn = __reader.get();
            if (is_escape(sn)) {
                buffer_append(convert2escape(sn));
                // parse hex string
            } else if (sn == 'x' || is_number(sn)) {
                std::string hex_oct = resolve_escape_number(sn);
                if (hex_oct.empty()) throw JsonException(__reader);
                buffer_append(hex_oct.c_str());
                // parse unicode string
            } else if (sn == 'u') {
                std::string unicodeS = resolve_escape_hex_unicode();
                if (unicodeS.empty()) throw JsonException(__reader);
                buffer_append(unicodeS.c_str());
            } else throw JsonException(__reader);
        } else if (s == '\"') {
            buffer_append('\"');
            for (;;) {
                char c = __reader.peek();
                if (c == JSON_SEPARATE || JsonParser::is_normal_char(c)) {
                    break;
                } else if (is_space_char(__reader.get()))continue;
                else throw JsonException(__reader);
            }
            break;
        } else buffer_append(s);
    }
    return buffer_str();
}